

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__horizontal_gather_3_channels_with_8_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pfVar8 = output_buffer + 3;
  pfVar9 = horizontal_coefficients + 4;
  while( true ) {
    pfVar1 = decode_buffer + (long)horizontal_contributors->n0 * 3;
    fVar11 = pfVar9[-4];
    fVar12 = pfVar9[-3];
    fVar2 = pfVar9[-2];
    fVar3 = pfVar9[-1];
    fVar4 = *pfVar9;
    fVar5 = pfVar9[1];
    fVar6 = pfVar9[2];
    fVar7 = pfVar9[3];
    fVar15 = pfVar1[0xe] * fVar4 + pfVar1[2] * fVar11;
    fVar16 = pfVar1[0xf] * fVar5 + pfVar1[3] * fVar12;
    fVar13 = fVar6 * pfVar1[0x14] + fVar2 * pfVar1[8];
    fVar14 = fVar7 * pfVar1[0x15] + fVar3 * pfVar1[9];
    fVar10 = fVar6 * pfVar1[0x12] + fVar2 * pfVar1[6] + pfVar1[0xc] * fVar4 + *pfVar1 * fVar11 +
             fVar14 + fVar16;
    fVar11 = fVar6 * pfVar1[0x13] + fVar2 * pfVar1[7] + pfVar1[0xd] * fVar4 + pfVar1[1] * fVar11 +
             fVar7 * pfVar1[0x16] + fVar3 * pfVar1[10] + fVar5 * pfVar1[0x10] + fVar12 * pfVar1[4];
    fVar12 = fVar13 + fVar15 +
             fVar7 * pfVar1[0x17] + fVar3 * pfVar1[0xb] + fVar5 * pfVar1[0x11] + fVar12 * pfVar1[5];
    if (output_buffer + output_sub_size * 3 <= pfVar8) break;
    horizontal_contributors = horizontal_contributors + 1;
    pfVar8[-3] = fVar10;
    pfVar8[-2] = fVar11;
    pfVar8[-1] = fVar12;
    *pfVar8 = fVar14 + fVar16 + fVar13 + fVar15;
    pfVar8 = pfVar8 + 3;
    pfVar9 = pfVar9 + coefficient_width;
  }
  *(ulong *)(pfVar8 + -3) = CONCAT44(fVar11,fVar10);
  pfVar8[-1] = fVar12;
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_8_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__store_output();
  } while ( output < output_end );
}